

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_math.h
# Opt level: O0

void m_rotation44(float *out,float angle,float x,float y,float z)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float c2;
  float s;
  float c;
  float z_local;
  float y_local;
  float x_local;
  float angle_local;
  float *out_local;
  
  fVar1 = cosf(angle * 0.017453292);
  fVar2 = sinf(angle * 0.017453292);
  fVar3 = 1.0 - fVar1;
  *out = x * x * fVar3 + fVar1;
  out[1] = y * x * fVar3 + z * fVar2;
  out[2] = x * z * fVar3 + -(y * fVar2);
  out[3] = 0.0;
  out[4] = x * y * fVar3 + -(z * fVar2);
  out[5] = y * y * fVar3 + fVar1;
  out[6] = y * z * fVar3 + x * fVar2;
  out[7] = 0.0;
  out[8] = x * z * fVar3 + y * fVar2;
  out[9] = y * z * fVar3 + -(x * fVar2);
  out[10] = z * z * fVar3 + fVar1;
  out[0xb] = 0.0;
  out[0xc] = 0.0;
  out[0xd] = 0.0;
  out[0xe] = 0.0;
  out[0xf] = 1.0;
  return;
}

Assistant:

static void m_rotation44(float *out, float angle, float x, float y, float z)
{
	angle *= M_M_PI / 180.0f;
	float c = cosf(angle), s = sinf(angle), c2 = 1.0f - c;
	out[ 0] = x*x*c2 + c;   out[ 1] = y*x*c2 + z*s; out[ 2] = x*z*c2 - y*s; out[ 3] = 0.0f;
	out[ 4] = x*y*c2 - z*s; out[ 5] = y*y*c2 + c;   out[ 6] = y*z*c2 + x*s; out[ 7] = 0.0f;
	out[ 8] = x*z*c2 + y*s; out[ 9] = y*z*c2 - x*s; out[10] = z*z*c2 + c;   out[11] = 0.0f;
	out[12] = 0.0f;         out[13] = 0.0f;         out[14] = 0.0f;         out[15] = 1.0f;
}